

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O0

int src_set_ratio(SRC_STATE *state,double new_ratio)

{
  int iVar1;
  double *in_RDI;
  double in_XMM0_Qa;
  SRC_PRIVATE *psrc;
  int local_4;
  
  if (in_RDI == (double *)0x0) {
    local_4 = 2;
  }
  else if ((in_RDI[5] == 0.0) || (in_RDI[6] == 0.0)) {
    local_4 = 7;
  }
  else {
    iVar1 = is_bad_src_ratio(in_XMM0_Qa);
    if (iVar1 == 0) {
      *in_RDI = in_XMM0_Qa;
      local_4 = 0;
    }
    else {
      local_4 = 6;
    }
  }
  return local_4;
}

Assistant:

int
src_set_ratio (SRC_STATE *state, double new_ratio)
{	SRC_PRIVATE *psrc ;

	psrc = (SRC_PRIVATE*) state ;

	if (psrc == NULL)
		return SRC_ERR_BAD_STATE ;
	if (psrc->vari_process == NULL || psrc->const_process == NULL)
		return SRC_ERR_BAD_PROC_PTR ;

	if (is_bad_src_ratio (new_ratio))
		return SRC_ERR_BAD_SRC_RATIO ;

	psrc->last_ratio = new_ratio ;

	return SRC_ERR_NO_ERROR ;
}